

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaKf.c
# Opt level: O2

int Kf_ManComputeRefs(Kf_Man_t *p)

{
  int *piVar1;
  float *pfVar2;
  float fVar3;
  float *pfVar4;
  float *pfVar5;
  Jf_Par_t *pJVar6;
  float fVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  Gia_Obj_t *pObj;
  int *piVar11;
  ulong uVar12;
  int iVar13;
  Gia_Man_t *pGVar14;
  int i;
  ulong uVar15;
  float fVar16;
  
  piVar11 = p->pGia->pRefs;
  if (piVar11 == (int *)0x0) {
    __assert_fail("p->pGia->pRefs != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaKf.c"
                  ,0x390,"int Kf_ManComputeRefs(Kf_Man_t *)");
  }
  pfVar4 = (p->vRefs).pArray;
  pfVar5 = (p->vArea).pArray;
  memset(piVar11,0,(long)p->pGia->nObjs << 2);
  pJVar6 = p->pPars;
  pJVar6->Area = 0;
  pJVar6->Edge = 0;
  pGVar14 = p->pGia;
  iVar13 = pGVar14->nObjs;
  do {
    if (iVar13 < 1) {
LAB_005eec8c:
      uVar12 = 0;
      uVar15 = (ulong)(uint)pGVar14->nObjs;
      if (pGVar14->nObjs < 1) {
        uVar15 = uVar12;
      }
      do {
        if (uVar15 == uVar12) {
          iVar13 = Kf_ManComputeDelay(p,1);
          pJVar6 = p->pPars;
          pJVar6->Delay = (long)iVar13;
          return (int)pJVar6->Area;
        }
        fVar3 = pfVar4[uVar12];
        fVar16 = 0.2;
        fVar7 = 0.8;
        if (p->pPars->fOptEdge != 0) {
          fVar7 = fVar16;
          fVar16 = 0.8;
        }
        fVar7 = fVar3 * fVar16 + (float)pGVar14->pRefs[uVar12] * fVar7;
        fVar16 = 1.0;
        if (1.0 <= fVar7) {
          fVar16 = fVar7;
        }
        pfVar5[uVar12] = (fVar3 * pfVar5[uVar12]) / fVar16;
        pfVar4[uVar12] = fVar16;
        pfVar2 = pfVar5 + uVar12;
        uVar12 = uVar12 + 1;
      } while (0.0 <= *pfVar2);
      __assert_fail("pFlow[i] >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaKf.c"
                    ,0x3a8,"int Kf_ManComputeRefs(Kf_Man_t *)");
    }
    iVar13 = iVar13 + -1;
    pObj = Gia_ManObj(pGVar14,iVar13);
    if (pObj == (Gia_Obj_t *)0x0) {
      pGVar14 = p->pGia;
      goto LAB_005eec8c;
    }
    iVar9 = (int)*(ulong *)pObj;
    uVar15 = *(ulong *)pObj & 0x1fffffff;
    if ((iVar9 < 0 && uVar15 != 0x1fffffff) || (iVar8 = Gia_ObjIsBuf(pObj), iVar8 != 0)) {
      pGVar14 = p->pGia;
      iVar9 = Gia_ObjId(pGVar14,pObj + -uVar15);
      piVar11 = pGVar14->pRefs + iVar9;
      *piVar11 = *piVar11 + 1;
    }
    else if ((-1 < iVar9 && (int)uVar15 != 0x1fffffff) &&
            (iVar9 = Gia_ObjRefNum(p->pGia,pObj), 0 < iVar9)) {
      piVar11 = Kf_ObjCutBest(p,iVar13);
      for (iVar9 = 1; iVar8 = *piVar11, iVar9 <= iVar8; iVar9 = iVar9 + 1) {
        pGVar14 = p->pGia;
        uVar10 = Kf_CutLeaf(piVar11,iVar9);
        piVar1 = pGVar14->pRefs + uVar10;
        *piVar1 = *piVar1 + 1;
      }
      pJVar6 = p->pPars;
      pJVar6->Area = pJVar6->Area + 1;
      pJVar6->Edge = (long)iVar8 + pJVar6->Edge;
    }
    pGVar14 = p->pGia;
  } while( true );
}

Assistant:

int Kf_ManComputeRefs( Kf_Man_t * p )
{
    Gia_Obj_t * pObj; 
    float nRefsNew; int i, * pCut;
    float * pRefs = Vec_FltArray(&p->vRefs);
    float * pFlow = Vec_FltArray(&p->vArea);
    assert( p->pGia->pRefs != NULL );
    memset( p->pGia->pRefs, 0, sizeof(int) * Gia_ManObjNum(p->pGia) );
    p->pPars->Area = p->pPars->Edge = 0;
    Gia_ManForEachObjReverse( p->pGia, pObj, i )
    {
        if ( Gia_ObjIsCo(pObj) || Gia_ObjIsBuf(pObj) )
            Gia_ObjRefInc( p->pGia, Gia_ObjFanin0(pObj) );
        else if ( Gia_ObjIsAnd(pObj) && Gia_ObjRefNum(p->pGia, pObj) > 0 )
        {
            pCut = Kf_ObjCutBest(p, i);
            Kf_CutRef( p, pCut );
            p->pPars->Edge += Kf_CutSize(pCut);
            p->pPars->Area++;
        }
    }
    // blend references and normalize flow
    for ( i = 0; i < Gia_ManObjNum(p->pGia); i++ )
    {
        if ( p->pPars->fOptEdge )
            nRefsNew = Abc_MaxFloat( 1, 0.8 * pRefs[i] + 0.2 * p->pGia->pRefs[i] );
        else
            nRefsNew = Abc_MaxFloat( 1, 0.2 * pRefs[i] + 0.8 * p->pGia->pRefs[i] );
        pFlow[i] = pFlow[i] * pRefs[i] / nRefsNew;
        pRefs[i] = nRefsNew;
        assert( pFlow[i] >= 0 );
    }
    // compute delay
    p->pPars->Delay = Kf_ManComputeDelay( p, 1 );
    return p->pPars->Area;
}